

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O0

string * CLI::detail::get_environment_value(string *__return_storage_ptr__,string *env_name)

{
  char *pcVar1;
  allocator local_49;
  string local_48 [39];
  undefined1 local_21;
  char *local_20;
  char *buffer;
  string *env_name_local;
  string *ename_string;
  
  local_20 = (char *)0x0;
  local_21 = 0;
  buffer = (char *)env_name;
  env_name_local = __return_storage_ptr__;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  pcVar1 = (char *)::std::__cxx11::string::c_str();
  pcVar1 = getenv(pcVar1);
  if (pcVar1 != (char *)0x0) {
    local_20 = pcVar1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_48,pcVar1,&local_49);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_48);
    ::std::__cxx11::string::~string(local_48);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_environment_value(const std::string &env_name) {
    char *buffer = nullptr;
    std::string ename_string;

#ifdef _MSC_VER
    // Windows version
    std::size_t sz = 0;
    if(_dupenv_s(&buffer, &sz, env_name.c_str()) == 0 && buffer != nullptr) {
        ename_string = std::string(buffer);
        free(buffer);
    }
#else
    // This also works on Windows, but gives a warning
    buffer = std::getenv(env_name.c_str());
    if(buffer != nullptr) {
        ename_string = std::string(buffer);
    }
#endif
    return ename_string;
}